

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O3

void init_vec(vec *v,uint64 ele_size)

{
  void *pvVar1;
  
  v->size = 0;
  v->cap = 8;
  v->element_size = (uint32)ele_size;
  pvVar1 = malloc(ele_size * 8);
  v->start = pvVar1;
  v->get_size = get_size;
  v->get_cap = get_cap;
  v->get_ele = get_ele;
  v->get_first_ele = get_first_ele;
  v->get_last_ele = get_last_ele;
  v->append = append;
  return;
}

Assistant:

void init_vec(vec *v, uint64 ele_size) {
    v->size = 0;
    v->cap = VEC_INIT_SIZE;
    v->element_size = ele_size;
    v->start = malloc(VEC_INIT_SIZE * ele_size);
    v->get_size = get_size;
    v->get_cap = get_cap;
    v->get_ele = get_ele;
    v->get_first_ele = get_first_ele;
    v->get_last_ele = get_last_ele;
    v->append = append;
}